

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

int CBinds::GetModifierMask(IInput *i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = (*(i->super_IInterface)._vptr_IInterface[4])(i,0x161);
  iVar2 = (*(i->super_IInterface)._vptr_IInterface[4])(i,0x165);
  iVar3 = (*(i->super_IInterface)._vptr_IInterface[4])(i,0x160);
  iVar4 = (*(i->super_IInterface)._vptr_IInterface[4])(i,0x164);
  uVar5 = (*(i->super_IInterface)._vptr_IInterface[4])(i,0x162);
  iVar1 = (uint)(byte)((byte)iVar2 | (byte)iVar1) * 2 + (uint)(byte)((byte)iVar4 | (byte)iVar3) * 4
          + (uVar5 & 0xff) * 8;
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

int CBinds::GetModifierMask(IInput *i)
{
	int Mask = 0;
	// since we only handle one modifier, when doing ctrl+q and shift+q, execute both
	Mask |= i->KeyIsPressed(KEY_LSHIFT) << CBinds::MODIFIER_SHIFT;
	Mask |= i->KeyIsPressed(KEY_RSHIFT) << CBinds::MODIFIER_SHIFT;
	Mask |= i->KeyIsPressed(KEY_LCTRL) << CBinds::MODIFIER_CTRL;
	Mask |= i->KeyIsPressed(KEY_RCTRL) << CBinds::MODIFIER_CTRL;
	Mask |= i->KeyIsPressed(KEY_LALT) << CBinds::MODIFIER_ALT;
	if(Mask == 0)
		return 1; // if no modifier, flag with MODIFIER_NONE
	return Mask;
}